

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TestCaseNode *testCaseNode;
  element_type *peVar4;
  string *text;
  long in_RSI;
  long in_RDI;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  ScopedElement properties;
  TestGroupStats *stats;
  ScopedElement e;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  *in_stack_fffffffffffffa88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  ScopedElement *this_00;
  string *in_stack_fffffffffffffa98;
  ScopedElement *in_stack_fffffffffffffaa0;
  ScopedElement *this_01;
  undefined4 in_stack_fffffffffffffaa8;
  XmlFormatting in_stack_fffffffffffffaac;
  string *in_stack_fffffffffffffab0;
  XmlWriter *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  string *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  allocator *paVar5;
  XmlWriter *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  XmlWriter *in_stack_fffffffffffffb00;
  JunitReporter *this_02;
  string local_430 [39];
  undefined1 local_409 [49];
  string local_3d8 [39];
  undefined1 local_3b1 [49];
  reference local_380;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *local_378;
  __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  local_370;
  long local_368;
  XmlFormatting local_360;
  undefined1 local_359 [40];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [48];
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [55];
  allocator local_229;
  string local_228 [48];
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  size_t local_118;
  allocator local_109;
  string local_108 [32];
  long local_e8;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89 [33];
  long local_68;
  allocator local_49;
  string local_48 [56];
  long local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"testsuite",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = local_10 + 8;
  testCaseNode = (TestCaseNode *)(in_RDI + 0xd8);
  this_02 = (JunitReporter *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"name",(allocator *)this_02);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"errors",&local_b1);
  XmlWriter::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(uint *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"failures",&local_d9);
  local_e8 = *(long *)(local_68 + 0x48) - (ulong)*(uint *)(in_RDI + 0x168);
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             (unsigned_long *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"tests",&local_109);
  local_118 = Counts::total((Counts *)(local_68 + 0x40));
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             (unsigned_long *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"hostname",&local_139);
  XmlWriter::writeAttribute<char[4]>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             &in_stack_fffffffffffffaf0->m_tagIsOpen);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x149882);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"time",&local_161);
    XmlWriter::writeAttribute<char[1]>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               &in_stack_fffffffffffffaf0->m_tagIsOpen);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"time",&local_189);
    (anonymous_namespace)::formatDuration_abi_cxx11_
              ((double)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"timestamp",&local_1d1);
  (anonymous_namespace)::getCurrentTimestamp_abi_cxx11_();
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x149d09);
  uVar3 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) == 0) {
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x149d3c);
    iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_0014a48a;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"properties",&local_229);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x149e08);
  uVar3 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"property",&local_261);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    paVar5 = &local_289;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"name",paVar5);
    XmlWriter::ScopedElement::writeAttribute<char[8]>
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               (char (*) [8])in_stack_fffffffffffffa90);
    paVar5 = &local_2b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"value",paVar5);
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x149f2e);
    (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)paVar5);
    XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
  }
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14a1cb);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,"property",&local_309);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"name",&local_331);
    in_stack_fffffffffffffab8 =
         (XmlWriter *)
         XmlWriter::ScopedElement::writeAttribute<char[12]>
                   (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                    (char (*) [12])in_stack_fffffffffffffa90);
    in_stack_fffffffffffffab0 = (string *)local_359;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_359 + 1),"value",(allocator *)in_stack_fffffffffffffab0);
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14a2e8);
    in_stack_fffffffffffffaac = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
    local_360 = in_stack_fffffffffffffaac;
    XmlWriter::ScopedElement::writeAttribute<unsigned_int>
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,(uint *)in_stack_fffffffffffffa90
              );
    std::__cxx11::string::~string((string *)(local_359 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_359);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffa90);
LAB_0014a48a:
  local_368 = local_10 + 0x80;
  local_370._M_current =
       (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
        *)clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
          ::begin(in_stack_fffffffffffffa88);
  local_378 = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
               *)clara::std::
                 vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                 ::end(in_stack_fffffffffffffa88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                             *)in_stack_fffffffffffffa90,
                            (__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                             *)in_stack_fffffffffffffa88), bVar1) {
    local_380 = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                ::operator*(&local_370);
    clara::std::
    __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffa90);
    writeTestCase(this_02,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
    ::operator++(&local_370);
  }
  text = (string *)(in_RDI + 0xd8);
  this_01 = (ScopedElement *)local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3b1 + 1),"system-out",(allocator *)this_01);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
  trim((string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  XmlWriter::ScopedElement::writeText
            (this_01,text,(XmlFormatting)((ulong)in_stack_fffffffffffffa90 >> 0x20));
  std::__cxx11::string::~string(local_3d8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffa90);
  std::__cxx11::string::~string((string *)(local_3b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3b1);
  this_00 = (ScopedElement *)local_409;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_409 + 1),"system-err",(allocator *)this_00);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
  trim((string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  XmlWriter::ScopedElement::writeText(this_01,text,(XmlFormatting)((ulong)this_00 >> 0x20));
  std::__cxx11::string::~string(local_430);
  XmlWriter::ScopedElement::~ScopedElement(this_00);
  std::__cxx11::string::~string((string *)(local_409 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_409);
  XmlWriter::ScopedElement::~ScopedElement(this_00);
  return;
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }